

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t *puVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  BaseType BVar9;
  SPIRType *pSVar10;
  long *plVar11;
  ulong uVar12;
  SPIRType *pSVar13;
  runtime_error *prVar14;
  char *pcVar15;
  size_type *psVar16;
  ulong uVar17;
  uint32_t width;
  _Alloc_hider _Var18;
  char (*in_R9) [2];
  bool bVar19;
  undefined4 uStack_218;
  BaseType input_type;
  string *local_210;
  string local_208;
  string cast_op1;
  string op;
  string right_arg;
  string left_arg;
  uint *local_160;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  bool local_110 [24];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar10 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                       (cop->basetype).id);
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  uVar8 = 0x81;
  if ((this->options).es != false) {
    uVar8 = 299;
  }
  iVar7 = *(int *)&(cop->super_IVariant).field_0xc;
  if (((this->options).version <= uVar8) &&
     (((iVar7 - 0x6dU < 0x40 && ((0x8000040012000019U >> ((ulong)(iVar7 - 0x6dU) & 0x3f) & 1) != 0))
      || ((iVar7 - 0xaeU < 0x15 && ((0x100015U >> (iVar7 - 0xaeU & 0x1f) & 1) != 0)))))) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&left_arg,"Unsigned integers are not supported on legacy targets.","");
    ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
    *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_210 = __return_storage_ptr__;
  if (iVar7 < 0x7e) {
    if (0x70 < iVar7) {
      if (2 < iVar7 - 0x71U) goto switchD_001b4aa2_caseD_7f;
      type_to_glsl_constructor_abi_cxx11_(&left_arg,this,pSVar10);
      ::std::__cxx11::string::operator=((string *)&op,(string *)&left_arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)left_arg._M_dataplus._M_p != &left_arg.field_2) {
        operator_delete(left_arg._M_dataplus._M_p);
      }
      goto LAB_001b54ba;
    }
    if (iVar7 != 0x4f) {
      if (iVar7 != 0x51) {
        if (iVar7 == 0x52) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&left_arg,"OpCompositeInsert spec constant op is not supported.","");
          ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
          *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto switchD_001b4aa2_caseD_7f;
      }
      puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      access_chain_internal_abi_cxx11_
                (__return_storage_ptr__,this,*puVar2,puVar2 + 1,
                 (int)(cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1,1,
                 (AccessChainMeta *)0x0);
      goto LAB_001b545c;
    }
    type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,pSVar10);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pSVar10 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    uVar8 = pSVar10->vecsize;
    to_enclosed_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    to_enclosed_expression_abi_cxx11_
              (&right_arg,this,(cop->arguments).super_VectorView<unsigned_int>.ptr[1],true);
    if (2 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
      paVar1 = &cast_op1.field_2;
      uVar17 = 2;
      do {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        if ((cop->arguments).super_VectorView<unsigned_int>.ptr[uVar17] < uVar8) {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,left_arg._M_dataplus._M_p,
                     left_arg._M_dataplus._M_p +
                     CONCAT44(left_arg._M_string_length._4_4_,(undefined4)left_arg._M_string_length)
                    );
          ::std::__cxx11::string::append((char *)&local_208);
          plVar11 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_208,local_208._M_string_length,0,'\x01');
          psVar16 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar16) {
            cast_op1.field_2._M_allocated_capacity = *psVar16;
            cast_op1.field_2._8_8_ = plVar11[3];
            cast_op1._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            cast_op1.field_2._M_allocated_capacity = *psVar16;
            cast_op1._M_dataplus._M_p = (pointer)*plVar11;
          }
          cast_op1._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_210,(ulong)cast_op1._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_op1._M_dataplus._M_p != paVar1) {
            operator_delete(cast_op1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
LAB_001b4e76:
            operator_delete(local_208._M_dataplus._M_p);
          }
        }
        else {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,right_arg._M_dataplus._M_p,
                     right_arg._M_dataplus._M_p + right_arg._M_string_length);
          ::std::__cxx11::string::append((char *)&local_208);
          plVar11 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_208,local_208._M_string_length,0,'\x01');
          psVar16 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar16) {
            cast_op1.field_2._M_allocated_capacity = *psVar16;
            cast_op1.field_2._8_8_ = plVar11[3];
            cast_op1._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            cast_op1.field_2._M_allocated_capacity = *psVar16;
            cast_op1._M_dataplus._M_p = (pointer)*plVar11;
          }
          cast_op1._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_210,(ulong)cast_op1._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_op1._M_dataplus._M_p != paVar1) {
            operator_delete(cast_op1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_001b4e76;
        }
        uVar17 = uVar17 + 1;
        uVar12 = (ulong)(uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size;
        if (uVar17 < uVar12) {
          ::std::__cxx11::string::append((char *)local_210);
          uVar12 = (ulong)(uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size;
        }
      } while (uVar17 < uVar12);
    }
    __return_storage_ptr__ = local_210;
    ::std::__cxx11::string::append((char *)local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    _Var18._M_p = left_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001b545c;
    goto LAB_001b5457;
  }
  switch(iVar7) {
  case 0x7e:
    pcVar15 = "-";
    goto LAB_001b4c42;
  default:
switchD_001b4aa2_caseD_7f:
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&left_arg,"Unimplemented spec constant op.","");
    ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
    *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x80:
    pcVar15 = "+";
    break;
  case 0x82:
    pcVar15 = "-";
    break;
  case 0x84:
    pcVar15 = "*";
    break;
  case 0x86:
  case 0x87:
    pcVar15 = "/";
    break;
  case 0x89:
  case 0x8b:
    pcVar15 = "%";
    break;
  case 0xa4:
  case 0xaa:
    pcVar15 = "==";
    break;
  case 0xa5:
  case 0xab:
    pcVar15 = "!=";
    break;
  case 0xa6:
    pcVar15 = "||";
    break;
  case 0xa7:
    pcVar15 = "&&";
    break;
  case 0xa8:
    pcVar15 = "!";
    goto LAB_001b4c42;
  case 0xa9:
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 3) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
      *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    in_R9 = (char (*) [2])(ulong)*puVar3;
    bVar6 = to_trivial_mix_op(this,pSVar10,&op,puVar3[2],puVar3[1],*puVar3);
    if (!bVar6) {
      puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      to_ternary_expression_abi_cxx11_
                (__return_storage_ptr__,this,pSVar10,*puVar2,puVar2[1],puVar2[2]);
      goto LAB_001b545c;
    }
LAB_001b54ba:
    iVar7 = *(int *)&(cop->super_IVariant).field_0xc;
    bVar6 = false;
    bVar4 = false;
    width = 0;
    bVar19 = false;
    bVar5 = false;
    if (iVar7 - 0x71U < 2) goto LAB_001b4f17;
    goto LAB_001b4f2c;
  case 0xac:
  case 0xad:
    pcVar15 = ">";
    break;
  case 0xae:
  case 0xaf:
    pcVar15 = ">=";
    break;
  case 0xb0:
  case 0xb1:
    pcVar15 = "<";
    break;
  case 0xb2:
  case 0xb3:
    pcVar15 = "<=";
    break;
  case 0xc2:
  case 0xc3:
    pcVar15 = ">>";
    break;
  case 0xc4:
    pcVar15 = "<<";
    break;
  case 0xc5:
    pcVar15 = "|";
    break;
  case 0xc6:
    pcVar15 = "^";
    break;
  case 199:
    pcVar15 = "&";
    break;
  case 200:
    pcVar15 = "~";
LAB_001b4c42:
    ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar15);
    bVar19 = false;
    bVar5 = true;
    goto LAB_001b4f17;
  }
  ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar15);
  bVar19 = true;
  bVar5 = false;
LAB_001b4f17:
  bVar4 = bVar5;
  bVar6 = bVar19;
  pSVar13 = Compiler::expression_type
                      (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
  width = pSVar13->width;
  iVar7 = *(int *)&(cop->super_IVariant).field_0xc;
LAB_001b4f2c:
  bVar19 = true;
  if (((0x2b < iVar7 - 0x80U) || ((0xc0000000015U >> ((ulong)(iVar7 - 0x80U) & 0x3f) & 1) == 0)) &&
     (3 < iVar7 - 0xc4U)) {
    bVar19 = false;
  }
  if (iVar7 < 0xaa) {
    if (iVar7 < 0x86) {
      if (iVar7 == 0x71) {
switchD_001b4fb7_caseD_86:
        BVar9 = to_unsigned_basetype(width);
        goto LAB_001b4fda;
      }
      if ((iVar7 == 0x72) || (iVar7 == 0x7e)) goto switchD_001b4fb7_caseD_87;
    }
    else {
      switch(iVar7) {
      case 0x86:
      case 0x89:
        goto switchD_001b4fb7_caseD_86;
      case 0x87:
      case 0x8b:
switchD_001b4fb7_caseD_87:
        BVar9 = to_signed_basetype(width);
        goto LAB_001b4fda;
      }
    }
switchD_001b4fb7_caseD_88:
    BVar9 = *(BaseType *)&(pSVar10->super_IVariant).field_0xc;
  }
  else {
    uVar8 = iVar7 - 0xaa;
    if (0x19 < uVar8) goto switchD_001b4fb7_caseD_88;
    if ((0x1000154U >> (uVar8 & 0x1f) & 1) != 0) goto switchD_001b4fb7_caseD_86;
    if ((0x20002a8U >> (uVar8 & 0x1f) & 1) != 0) goto switchD_001b4fb7_caseD_87;
    if ((3U >> (uVar8 & 0x1f) & 1) == 0) goto switchD_001b4fb7_caseD_88;
    BVar9 = to_signed_basetype(width);
  }
LAB_001b4fda:
  __return_storage_ptr__ = local_210;
  input_type = BVar9;
  if (bVar6) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 2) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
      *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    right_arg._M_string_length = 0;
    right_arg.field_2._M_local_buf[0] = '\0';
    cast_op1._M_string_length = 0;
    cast_op1.field_2._M_allocated_capacity =
         cast_op1.field_2._M_allocated_capacity & 0xffffffffffffff00;
    puVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
    right_arg._M_dataplus._M_p = (pointer)&right_arg.field_2;
    binary_op_bitcast_helper
              ((SPIRType *)&left_arg,this,&right_arg,&cast_op1,&input_type,*puVar2,puVar2[1],bVar19)
    ;
    __return_storage_ptr__ = local_210;
    BVar9 = *(BaseType *)&(pSVar10->super_IVariant).field_0xc;
    if (BVar9 == Boolean || BVar9 == input_type) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (local_210,(spirv_cross *)0x2f3fa1,(char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
                 (char (*) [2])&cast_op1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,
                 (char (*) [2])CONCAT44(input_type,uStack_218));
    }
    else {
      left_arg._M_string_length._4_4_ = input_type;
      (*(this->super_Compiler)._vptr_Compiler[0x34])(local_210,this);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_208,(spirv_cross *)&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
                 (char (*) [2])&cast_op1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(input_type,uStack_218));
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    left_arg._M_dataplus._M_p = (pointer)&PTR__SPIRType_003574a8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    if (local_160 != local_148) {
      free(local_160);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
      operator_delete(cast_op1._M_dataplus._M_p);
    }
    _Var18._M_p = right_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p == &right_arg.field_2) goto LAB_001b545c;
  }
  else if (bVar4) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
      *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bitcast_glsl_abi_cxx11_
              (&left_arg,this,pSVar10,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x2f3fa1,(char (*) [2])&op,&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,in_R9);
    _Var18 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001b545c;
  }
  else if (*(int *)&(cop->super_IVariant).field_0xc - 0x71U < 2) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
      *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar13 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    if ((pSVar13->width < pSVar10->width) &&
       (BVar9 != *(BaseType *)&(pSVar13->super_IVariant).field_0xc)) {
      SPIRType::SPIRType((SPIRType *)&left_arg,pSVar13);
      left_arg._M_string_length._4_4_ = BVar9;
      bitcast_glsl_abi_cxx11_
                (&right_arg,this,(SPIRType *)&left_arg,
                 *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3fa1,
                 (char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,in_R9
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
        operator_delete(right_arg._M_dataplus._M_p);
      }
      left_arg._M_dataplus._M_p = (pointer)&PTR__SPIRType_003574a8;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      local_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      local_120 = 0;
      if (local_128 != local_110) {
        free(local_128);
      }
      if (local_160 != local_148) {
        free(local_160);
      }
      goto LAB_001b545c;
    }
    to_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3fa1,
               (char (*) [2])&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,in_R9);
    _Var18 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001b545c;
  }
  else {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&left_arg);
      *(undefined ***)prVar14 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    to_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3fa1,
               (char (*) [2])&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,in_R9);
    _Var18 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001b545c;
  }
LAB_001b5457:
  operator_delete(_Var18._M_p);
LAB_001b545c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index >= left_components)
				expr += right_arg + "." + "xyzw"[index - left_components];
			else
				expr += left_arg + "." + "xyzw"[index];

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
		SPIRV_CROSS_THROW("OpCompositeInsert spec constant op is not supported.");

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}